

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

void __thiscall Heap<Astar<Tiles>::Node>::Maxq::push(Maxq *this,Node *n,int p)

{
  pointer pvVar1;
  ulong uVar2;
  Node *n_local;
  
  n_local = n;
  if (-1 < p) {
    uVar2 = (ulong)(uint)p;
    if ((ulong)(((long)(this->bins).
                       super__Vector_base<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->bins).
                      super__Vector_base<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar2) {
      std::
      vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
      ::resize(&this->bins,(ulong)(p + 1));
    }
    if (this->max < p) {
      this->max = p;
    }
    pvVar1 = (this->bins).
             super__Vector_base<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    n->openind = (int)((ulong)((long)*(pointer *)
                                      ((long)&pvVar1[uVar2].
                                              super__Vector_base<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>
                                              ._M_impl.super__Vector_impl_data + 8) -
                              *(long *)&pvVar1[uVar2].
                                        super__Vector_base<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>
                                        ._M_impl.super__Vector_impl_data) >> 3);
    std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>::push_back
              (pvVar1 + uVar2,&n_local);
    this->fill = this->fill + 1;
    return;
  }
  __assert_fail("p >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/heap.hpp"
                ,0x12,
                "void Heap<Astar<Tiles>::Node>::Maxq::push(HeapElm *, int) [HeapElm = Astar<Tiles>::Node]"
               );
}

Assistant:

void push(HeapElm *n, int p) {
			assert (p >= 0);
			if (bins.size() <= (unsigned int) p)
				bins.resize(p+1);

			if (p > max)
				max = p;

			n->openind = bins[p].size();
			bins[p].push_back(n);
			fill++;
		}